

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Var::assign_(Var *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  int iVar1;
  VarException *pVVar2;
  UserException *this_00;
  undefined4 in_register_00000014;
  shared_ptr<kratos::Var> *__args_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar4;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  IRNode *local_108;
  element_type *local_100;
  IRNode *local_f8;
  element_type *peStack_f0;
  undefined1 local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  __node_base _Stack_b8;
  size_type local_b0;
  _Prime_rehash_policy _Stack_a8;
  IRNode *pIStack_98;
  undefined8 local_90;
  string local_80;
  AssignmentType local_5c;
  undefined1 auStack_58 [4];
  AssignmentType type_local;
  pointer ppIStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  allocator_type local_29;
  
  __args_1 = (shared_ptr<kratos::Var> *)CONCAT44(in_register_00000014,type);
  if ((__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(auStack_58,var);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "Trying to assign null to ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58);
    UserException::UserException(this_00,(string *)local_d8);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = *(int *)&var[0x16].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  if (iVar1 == 1) {
    local_c8._M_allocated_capacity = (size_type)&pIStack_98;
    p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._8_8_ = 1;
    _Stack_b8._M_nxt = (_Hash_node_base *)0x0;
    local_b0 = 0;
    _Stack_a8._M_max_load_factor = 1.0;
    _Stack_a8._4_4_ = 0;
    _Stack_a8._M_next_resize = 0;
    pIStack_98 = (IRNode *)0x0;
    local_d8 = (undefined1  [8])&PTR_visit_root_002b3028;
    local_90 = 1;
    IRVisitor::visit_root((IRVisitor *)local_d8,(IRNode *)var);
    if ((char)local_90 == '\0') {
      pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
      (*(((__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_IRNode)._vptr_IRNode[0x1f])(&local_f8);
      local_48._M_allocated_capacity =
           (size_type)
           var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_48._8_8_ = var[8].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _auStack_58 = (pointer)local_f8;
      ppIStack_50 = (pointer)peStack_f0;
      format_str_00.size_ = 0xdd;
      format_str_00.data_ = (char *)0x22;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_80,(detail *)"Cannot assign {0} to an expression",format_str_00,args_00);
      local_100 = (__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_00._M_len = 2;
      __l_00._M_array = &local_108;
      local_108 = (IRNode *)var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_58,__l_00,&local_29);
      VarException::VarException
                (pVVar2,&local_80,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_58);
      __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_d8 = (undefined1  [8])&PTR_visit_root_002a82e0;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&local_c8);
  }
  else if (iVar1 == 3) {
    pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
    (*(((__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_IRNode)._vptr_IRNode[0x1f])(&local_80);
    local_c8._M_allocated_capacity =
         (size_type)
         var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_c8._8_8_ = var[8].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8 = (undefined1  [8])local_80._M_dataplus._M_p;
    p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x20;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)auStack_58,(detail *)"Cannot assign {0} to a const {1}",format_str,args);
    peStack_f0 = (__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 2;
    __l._M_array = &local_f8;
    local_f8 = (IRNode *)var;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_d8,
               __l,(allocator_type *)&local_108);
    VarException::VarException
              (pVVar2,(string *)auStack_58,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_d8);
    __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_d8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var[6].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<kratos::AssignStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::AssignStmt>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>const&,kratos::AssignmentType&>
            ((__shared_ptr<kratos::AssignStmt,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<kratos::AssignStmt> *)auStack_58,(shared_ptr<kratos::Var> *)local_d8,
             __args_1,&local_5c);
  _Var3._M_pi = extraout_RDX;
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Var::assign_(const std::shared_ptr<Var> &var, AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // if it's a constant or expression, it can't be assigned to
    if (type_ == VarType::ConstValue) {
        throw VarException(::format("Cannot assign {0} to a const {1}", var->to_string(), name),
                           {this, var.get()});
    } else if (type_ == VarType::Expression) {
        auto all_concat = AllConcat();
        all_concat.visit_root(this);
        if (!all_concat.legal)
            throw VarException(
                ::format("Cannot assign {0} to an expression", var->to_string(), name),
                {this, var.get()});
    }

    auto stmt = ::make_shared<AssignStmt>(shared_from_this(), var, type);

    return stmt;
}